

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O1

bool __thiscall
Rml::ConvolutionFilter::Initialise
          (ConvolutionFilter *this,Vector2i _kernel_radii,FilterOperation _operation)

{
  float *pfVar1;
  code *pcVar2;
  bool bVar3;
  float *__s;
  Vector2i VVar4;
  long lVar5;
  ulong __n;
  
  if (((ulong)_kernel_radii & 0x8000000080000000) == 0) {
    VVar4 = (Vector2i)((long)_kernel_radii * 2 | 0x100000001);
    this->kernel_size = VVar4;
    lVar5 = (long)(this->kernel_size).y * (long)VVar4.x;
    __n = 0xffffffffffffffff;
    if (-1 < (int)lVar5) {
      __n = lVar5 * 4;
    }
    __s = (float *)operator_new__(__n);
    memset(__s,0,__n);
    pfVar1 = (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
    if (pfVar1 != (float *)0x0) {
      operator_delete__(pfVar1);
    }
    this->operation = _operation;
  }
  else {
    bVar3 = Assert("Invalid input parameters to convolution filter.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                   ,0x31);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return ((ulong)_kernel_radii & 0x8000000080000000) == 0;
}

Assistant:

bool ConvolutionFilter::Initialise(Vector2i _kernel_radii, FilterOperation _operation)
{
	if (_kernel_radii.x < 0 || _kernel_radii.y < 0)
	{
		RMLUI_ERRORMSG("Invalid input parameters to convolution filter.");
		return false;
	}

	kernel_size = _kernel_radii * 2 + Vector2i(1);

	kernel = UniquePtr<float[]>(new float[kernel_size.x * kernel_size.y]());

	operation = _operation;
	return true;
}